

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SizedPtr google::protobuf::internal::anon_unknown_12::AllocateBlock
                   (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  unsigned_long uVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  unsigned_long *puVar3;
  SizedPtr SVar4;
  code *local_a0 [3];
  LogMessage local_88;
  Voidify local_71;
  unsigned_long local_70;
  unsigned_long local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t size;
  AllocationPolicy policy;
  size_t min_bytes_local;
  size_t last_size_local;
  AllocationPolicy *policy_ptr_local;
  
  policy.block_dealloc = (_func_void_void_ptr_size_t *)min_bytes;
  AllocationPolicy::AllocationPolicy((AllocationPolicy *)&size);
  if (policy_ptr != (AllocationPolicy *)0x0) {
    size = policy_ptr->start_block_size;
    policy.start_block_size = policy_ptr->max_block_size;
    policy.max_block_size = (size_t)policy_ptr->block_alloc;
    policy.block_alloc = (_func_void_ptr_size_t *)policy_ptr->block_dealloc;
  }
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)AllocationSize(last_size,size,policy.start_block_size);
  local_68 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((unsigned_long)policy.block_dealloc);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  local_70 = absl::lts_20250127::log_internal::GetReferenceableValue(uVar1 - 0x10);
  local_60 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_68,&local_70,
                        "min_bytes <= std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize"
                       );
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x4b,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_88);
  }
  local_a0[0] = policy.block_dealloc + 0x10;
  puVar3 = std::max<unsigned_long>
                     ((unsigned_long *)&absl_log_internal_check_op_result,(unsigned_long *)local_a0)
  ;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)*puVar3;
  SVar4 = AllocateMemory((AllocationPolicy *)&size,(size_t)absl_log_internal_check_op_result);
  return SVar4;
}

Assistant:

SizedPtr AllocateBlock(const AllocationPolicy* policy_ptr, size_t last_size,
                       size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size =
      AllocationSize(last_size, policy.start_block_size, policy.max_block_size);
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  ABSL_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() -
                               SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  return AllocateMemory(policy, size);
}